

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall cmFindPackageCommand::CheckVersion(cmFindPackageCommand *this,string *config_file)

{
  bool bVar1;
  bool bVar2;
  string version_file;
  string version;
  string version_file_base;
  ConfigFileInfo configFileInfo;
  
  std::__cxx11::string::string((string *)&version,"unknown",(allocator *)&configFileInfo);
  std::__cxx11::string::rfind((char)config_file,0x2e);
  std::__cxx11::string::substr((ulong)&version_file_base,(ulong)config_file);
  std::__cxx11::string::string((string *)&version_file,(string *)&version_file_base);
  std::__cxx11::string::append((char *)&version_file);
  bVar1 = cmsys::SystemTools::FileExists(version_file._M_dataplus._M_p,true);
  if (bVar1) {
    bVar2 = CheckVersionFile(this,&version_file,&version);
  }
  else {
    bVar2 = false;
  }
  std::__cxx11::string::_M_assign((string *)&version_file);
  std::__cxx11::string::append((char *)&version_file);
  if (!bVar1) {
    bVar1 = cmsys::SystemTools::FileExists(version_file._M_dataplus._M_p,true);
    if (bVar1) {
      bVar2 = CheckVersionFile(this,&version_file,&version);
    }
    else {
      bVar2 = (bool)((this->Version)._M_string_length == 0 | bVar2);
    }
  }
  configFileInfo.filename._M_dataplus._M_p = (pointer)&configFileInfo.filename.field_2;
  configFileInfo.filename._M_string_length = 0;
  configFileInfo.filename.field_2._M_local_buf[0] = '\0';
  configFileInfo.version._M_dataplus._M_p = (pointer)&configFileInfo.version.field_2;
  configFileInfo.version._M_string_length = 0;
  configFileInfo.version.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&configFileInfo);
  std::__cxx11::string::_M_assign((string *)&configFileInfo.version);
  std::
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  ::push_back(&this->ConsideredConfigs,&configFileInfo);
  ConfigFileInfo::~ConfigFileInfo(&configFileInfo);
  std::__cxx11::string::~string((string *)&version_file);
  std::__cxx11::string::~string((string *)&version_file_base);
  std::__cxx11::string::~string((string *)&version);
  return bVar2;
}

Assistant:

bool cmFindPackageCommand::CheckVersion(std::string const& config_file)
{
  bool result = false; // by default, assume the version is not ok.
  bool haveResult = false;
  std::string version = "unknown";

  // Get the filename without the .cmake extension.
  std::string::size_type pos = config_file.rfind('.');
  std::string version_file_base = config_file.substr(0, pos);

  // Look for foo-config-version.cmake
  std::string version_file = version_file_base;
  version_file += "-version.cmake";
  if ((haveResult == false)
       && (cmSystemTools::FileExists(version_file.c_str(), true)))
    {
    result = this->CheckVersionFile(version_file, version);
    haveResult = true;
    }

  // Look for fooConfigVersion.cmake
  version_file = version_file_base;
  version_file += "Version.cmake";
  if ((haveResult == false)
       && (cmSystemTools::FileExists(version_file.c_str(), true)))
    {
    result = this->CheckVersionFile(version_file, version);
    haveResult = true;
    }


  // If no version was requested a versionless package is acceptable.
  if ((haveResult == false) && (this->Version.empty()))
    {
    result = true;
    }

  ConfigFileInfo configFileInfo;
  configFileInfo.filename = config_file;
  configFileInfo.version = version;
  this->ConsideredConfigs.push_back(configFileInfo);

  return result;
}